

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O0

void avl_init(avl_tree *tree,_func_int_void_ptr_void_ptr *comp,_Bool allow_dups)

{
  _Bool allow_dups_local;
  _func_int_void_ptr_void_ptr *comp_local;
  avl_tree *tree_local;
  
  (tree->list_head).prev = &tree->list_head;
  (tree->list_head).next = &tree->list_head;
  tree->root = (avl_node *)0x0;
  tree->count = 0;
  tree->comp = comp;
  tree->allow_dups = allow_dups;
  return;
}

Assistant:

void
avl_init(struct avl_tree *tree, int (*comp)(const void *k1, const void *k2), bool allow_dups) {
  list_init_head(&tree->list_head);
  tree->root = NULL;
  tree->count = 0;
  tree->comp = comp;
  tree->allow_dups = allow_dups;
}